

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

NetType * __thiscall slang::ast::Scope::getDefaultNetType(Scope *this)

{
  Symbol *pSVar1;
  Scope *pSVar2;
  NetType *pNVar3;
  Scope *current;
  
  pSVar2 = this;
  while( true ) {
    pSVar1 = pSVar2->thisSym;
    if (pSVar1->kind == InstanceBody) {
      return *(NetType **)(pSVar1[2].name._M_str + 0x40);
    }
    if (pSVar1->kind == Package) break;
    pSVar2 = pSVar1->parentScope;
    if (pSVar2 == (Scope *)0x0) {
      pNVar3 = Compilation::getNetType(this->compilation,Unknown);
      return pNVar3;
    }
  }
  return (NetType *)pSVar1[1].originatingSyntax;
}

Assistant:

const NetType& Scope::getDefaultNetType() const {
    const Scope* current = this;
    do {
        auto& sym = current->asSymbol();
        switch (sym.kind) {
            case SymbolKind::Package:
                return sym.as<PackageSymbol>().defaultNetType;
            default:
                if (sym.kind == SymbolKind::InstanceBody)
                    return sym.as<InstanceBodySymbol>().getDefinition().defaultNetType;
                else
                    current = sym.getParentScope();
                break;
        }
    } while (current);

    return getCompilation().getNetType(TokenKind::Unknown);
}